

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMP_Next.cpp
# Opt level: O1

void get_next(string *t)

{
  ulong uVar1;
  pointer pcVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  
  memset(nexta,0x3f,0x194);
  nexta[1] = 0;
  uVar1 = t->_M_string_length;
  uVar3 = 1;
  if (1 < uVar1) {
    iVar4 = 0;
    uVar6 = 1;
    do {
      if ((iVar4 == 0) || (pcVar2 = (t->_M_dataplus)._M_p, pcVar2[uVar6] == pcVar2[iVar4])) {
        iVar4 = iVar4 + 1;
        lVar7 = (long)(int)uVar3;
        uVar3 = uVar3 + 1;
        nexta[lVar7 + 1] = iVar4;
      }
      else {
        iVar4 = nexta[iVar4];
      }
      uVar6 = (ulong)(int)uVar3;
    } while (uVar6 < uVar1);
  }
  if (1 < (int)uVar3) {
    lVar7 = 0;
    do {
      pcVar8 = " ";
      if (lVar7 == 0) {
        pcVar8 = "   next:";
      }
      lVar5 = 1;
      if (lVar7 == 0) {
        lVar5 = 8;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar5);
      lVar5 = std::cout;
      *(uint *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) =
           *(uint *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) | 0x80;
      *(undefined8 *)(memmove + *(long *)(lVar5 + -0x18)) = 2;
      std::ostream::operator<<((ostream *)&std::cout,nexta[lVar7 + 1]);
      lVar7 = lVar7 + 1;
    } while ((ulong)uVar3 - 1 != lVar7);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void get_next(string t) {
    ms(nexta,INF);
    int i = 1, j = 0;
    nexta[1] = 0;
    while(i < t.length()) {
        if(j==0 || t[i]==t[j]) {
            ++i; ++j;
            nexta[i] = j;
        }
        else j = nexta[j];
    }
    for(int k = 1; k < i; k++) {
        cout << (k==1?"   next:":" ") << setiosflags(ios::right) << setw(2) << nexta[k];
    }
    cout << endl;
}